

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMisc.h
# Opt level: O2

char * stristr(char *String,char *Pattern)

{
  int iVar1;
  int iVar2;
  char cVar3;
  char *pcVar4;
  char *pcVar5;
  char cVar6;
  char *pcVar7;
  
  do {
    cVar3 = *String;
    if (cVar3 == '\0') {
      return (char *)0x0;
    }
    cVar6 = *Pattern;
    iVar1 = toupper((int)cVar6);
    pcVar7 = String;
    while( true ) {
      String = pcVar7 + 1;
      if (cVar3 == '\0') {
        return (char *)0x0;
      }
      iVar2 = toupper((int)cVar3);
      pcVar4 = Pattern + 1;
      pcVar5 = pcVar7;
      if (iVar2 == iVar1) break;
      cVar3 = *String;
      pcVar7 = String;
    }
    while( true ) {
      iVar1 = toupper((int)*pcVar5);
      iVar2 = toupper((int)cVar6);
      if (iVar1 != iVar2) break;
      cVar6 = *pcVar4;
      pcVar4 = pcVar4 + 1;
      pcVar5 = pcVar5 + 1;
      if (cVar6 == '\0') {
        return pcVar7;
      }
    }
  } while( true );
}

Assistant:

inline char* stristr(char* String, char* Pattern)
{
	char* pptr = NULL;
	char* sptr = NULL;
	char* start = NULL;

	for (start = (char*)String; *start != 0; start++)
	{
		// Find start of pattern in string.
		for (; ((*start != 0) && (toupper(*start)!= toupper(*Pattern))); start++)
			;
		if (0 == *start)
			return NULL;

		pptr = (char*)Pattern;
		sptr = (char*)start;

		while (toupper(*sptr) == toupper(*pptr))
		{
			sptr++;
			pptr++;

			// If end of pattern then pattern was found.

			if (0 == *pptr)
				return (start);
		}
	}

	return NULL;
}